

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::MinerImpl::isTestChain(MinerImpl *this)

{
  long lVar1;
  ChainstateManager *pCVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = chainman(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ((pCVar2->m_options).chainparams)->m_chain_type != MAIN;
  }
  __stack_chk_fail();
}

Assistant:

bool isTestChain() override
    {
        return chainman().GetParams().IsTestChain();
    }